

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.cpp
# Opt level: O0

void __thiscall DecHeap::bubble_up(DecHeap *this,size_t idx)

{
  ulong uVar1;
  bool bVar2;
  reference pvVar3;
  size_type local_18;
  size_t idx_local;
  DecHeap *this_local;
  
  local_18 = idx;
  while( true ) {
    bVar2 = false;
    if (local_18 != 0) {
      pvVar3 = std::
               vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ::operator[](&this->heap,local_18 - 1 >> 1);
      uVar1 = pvVar3->first;
      pvVar3 = std::
               vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ::operator[](&this->heap,local_18);
      bVar2 = pvVar3->first < uVar1;
    }
    if (!bVar2) break;
    swap(this,local_18 - 1 >> 1,local_18);
    local_18 = local_18 - 1 >> 1;
  }
  return;
}

Assistant:

void DecHeap::bubble_up(size_t idx) {
    while (idx && heap[(idx - 1)/2].first > heap[idx].first) {
        this->swap((idx - 1)/2, idx);
        idx = (idx - 1) / 2;
    }
}